

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void block_free(block_s *blk)

{
  uint16_t *puVar1;
  block_s *__s;
  block_s *__addr;
  long lVar2;
  fio_lock_i ret;
  fio_lock_i ret_1;
  
  LOCK();
  puVar1 = &blk->ref;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    __s = blk + 1;
    memset(__s,0,0x7ff0);
    fio_lock(&memory.lock);
    blk[1].parent = (block_s *)memory.available.prev;
    *(anon_struct_32_4_90625080 **)&blk[1].ref = &memory;
    (memory.available.prev)->next = (fio_ls_embd_s *)__s;
    __addr = blk->parent;
    LOCK();
    puVar1 = &__addr->root_ref;
    memory.available.prev = (fio_ls_embd_s *)__s;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if (*puVar1 == 0) {
      for (lVar2 = 0; lVar2 != 0x800000; lVar2 = lVar2 + 0x8000) {
        fio_ls_embd_remove((fio_ls_embd_s *)((long)&__addr[1].parent + lVar2));
      }
      LOCK();
      memory.lock = '\0';
      UNLOCK();
      munmap(__addr,0x800000);
      if (4 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:7146): memory allocator returned %p to the system"
                       ,__addr);
        return;
      }
    }
    else {
      LOCK();
      memory.lock = '\0';
      UNLOCK();
    }
  }
  return;
}

Assistant:

static inline void block_free(block_s *blk) {
  if (fio_atomic_sub(&blk->ref, 1))
    return;

  memset(blk + 1, 0, (FIO_MEMORY_BLOCK_SIZE - sizeof(*blk)));
  fio_lock(&memory.lock);
  fio_ls_embd_push(&memory.available, &((block_node_s *)blk)->node);

  blk = blk->parent;

  if (fio_atomic_sub(&blk->root_ref, 1)) {
    fio_unlock(&memory.lock);
    return;
  }
  // fio_unlock(&memory.lock);
  // return;

  /* remove all of the root block's children (slices) from the memory pool */
  for (size_t i = 0; i < FIO_MEMORY_BLOCKS_PER_ALLOCATION; ++i) {
    block_node_s *pos =
        (block_node_s *)((uintptr_t)blk + (i * FIO_MEMORY_BLOCK_SIZE));
    fio_ls_embd_remove(&pos->node);
  }

  fio_unlock(&memory.lock);
  sys_free(blk, FIO_MEMORY_BLOCK_SIZE * FIO_MEMORY_BLOCKS_PER_ALLOCATION);
  FIO_LOG_DEBUG("memory allocator returned %p to the system", (void *)blk);
  FIO_MEMORY_ON_BLOCK_FREE();
}